

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_wString __thiscall
ON_TextureMapping::ProjectionToString(ON_TextureMapping *this,PROJECTION texture_mapping_projection)

{
  PROJECTION texture_mapping_projection_local;
  
  if (texture_mapping_projection == no_projection) {
    ON_wString::ON_wString((ON_wString *)this,"ON_TextureMapping::PROJECTION::no_projection");
  }
  else if (texture_mapping_projection == clspt_projection) {
    ON_wString::ON_wString((ON_wString *)this,"ON_TextureMapping::PROJECTION::clspt_projection");
  }
  else if (texture_mapping_projection == ray_projection) {
    ON_wString::ON_wString((ON_wString *)this,"ON_TextureMapping::PROJECTION::ray_projection");
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0xab1,"","Invalid texture_mapping_projection value.");
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_TextureMapping::ProjectionToString(ON_TextureMapping::PROJECTION texture_mapping_projection)
{
  switch (texture_mapping_projection)
  {
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::PROJECTION::no_projection);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::PROJECTION::clspt_projection);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::PROJECTION::ray_projection);
  }

  ON_ERROR("Invalid texture_mapping_projection value.");
  return ON_wString::EmptyString;
}